

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

bool anon_unknown.dwarf_6e62ef::NotInProjectDir::IsInDirectory(string *baseDir,string *testDir)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  undefined1 local_21;
  string *testDir_local;
  string *baseDir_local;
  
  lVar1 = std::__cxx11::string::find((string *)testDir,(ulong)baseDir);
  if (lVar1 == 0) {
    lVar1 = std::__cxx11::string::size();
    lVar2 = std::__cxx11::string::size();
    local_21 = true;
    if (lVar1 != lVar2) {
      std::__cxx11::string::size();
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)testDir);
      local_21 = *pcVar3 == '/';
    }
    baseDir_local._7_1_ = local_21;
  }
  else {
    baseDir_local._7_1_ = false;
  }
  return baseDir_local._7_1_;
}

Assistant:

static bool IsInDirectory(const std::string& baseDir,
                            const std::string& testDir)
  {
    // First check if the test directory "starts with" the base directory:
    if (testDir.find(baseDir) != 0) {
      return false;
    }
    // If it does, then check that it's either the same string, or that the
    // next character is a slash:
    return ((testDir.size() == baseDir.size()) ||
            (testDir[baseDir.size()] == '/'));
  }